

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QString * __thiscall QAccessibleTableCell::text(QAccessibleTableCell *this,Text t)

{
  bool bVar1;
  ulong uVar2;
  QAbstractItemModel *this_00;
  int in_EDX;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel *model;
  QString *value;
  QString *in_stack_fffffffffffffea8;
  QString *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  QPersistentModelIndex local_f8 [6];
  QPersistentModelIndex local_c8 [6];
  QPersistentModelIndex local_98 [6];
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x7f9b5b);
  uVar2 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar2 & 1) != 0) {
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f9b8a);
    this_00 = QAbstractItemView::model
                        ((QAbstractItemView *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (in_EDX == 0) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_98);
      (**(code **)(*(long *)this_00 + 0x90))(&local_28,this_00,local_98,0xb);
      ::QVariant::toString();
      QString::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      QString::~QString((QString *)0x7f9c2e);
      ::QVariant::~QVariant(&local_28);
      bVar1 = QString::isEmpty((QString *)0x7f9c45);
      if (bVar1) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_c8);
        (**(code **)(*(long *)this_00 + 0x90))(&local_48,this_00,local_c8,0);
        ::QVariant::toString();
        QString::operator=((QString *)this_00,in_stack_fffffffffffffea8);
        QString::~QString((QString *)0x7f9cc2);
        ::QVariant::~QVariant(&local_48);
      }
    }
    else if (in_EDX == 1) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
      (**(code **)(*(long *)this_00 + 0x90))(&local_68,this_00,local_f8,0xc);
      ::QVariant::toString();
      QString::operator=(in_stack_fffffffffffffeb0,(QString *)this_00);
      QString::~QString((QString *)0x7f9d37);
      ::QVariant::~QVariant(&local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTableCell::text(QAccessible::Text t) const
{
    QString value;
    if (!isValid())
        return value;
    QAbstractItemModel *model = view->model();
    switch (t) {
    case QAccessible::Name:
        value = model->data(m_index, Qt::AccessibleTextRole).toString();
        if (value.isEmpty())
            value = model->data(m_index, Qt::DisplayRole).toString();
        break;
    case QAccessible::Description:
        value = model->data(m_index, Qt::AccessibleDescriptionRole).toString();
        break;
    default:
        break;
    }
    return value;
}